

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_float64_primitive_subtract
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_object_tuple_t *psVar2;
  double dVar3;
  double dVar4;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  dVar3 = 0.0;
  dVar4 = 0.0;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    dVar4 = *(double *)(uVar1 + 0x10);
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    dVar3 = *(double *)(uVar1 + 0x10);
  }
  psVar2 = sysbvm_context_allocateByteTuple(context,(context->roots).float64Type,8);
  psVar2->field_1 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)(dVar4 - dVar3);
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_subtract(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_float64_t left = sysbvm_tuple_float64_decode(arguments[0]);
    sysbvm_float64_t right = sysbvm_tuple_float64_decode(arguments[1]);
    return sysbvm_tuple_float64_encode(context, left - right);
}